

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O0

void QApplication::alert(QWidget *widget,int duration)

{
  bool bVar1;
  QWindow *pQVar2;
  const_iterator o;
  undefined4 in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  QWidget *topLevel;
  QWidgetList *__range2;
  QWindow *window;
  const_iterator __end2;
  const_iterator __begin2;
  QWidgetList topLevels;
  WindowState in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined1 uVar3;
  QWidget *in_stack_ffffffffffffff98;
  QWidget *in_stack_ffffffffffffffa0;
  undefined8 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  const_iterator local_30;
  QWidget *in_stack_ffffffffffffffd8;
  QFlagsStorageHelper<Qt::WindowState,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    topLevelWidgets();
    local_30.i = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
    local_30 = QList<QWidget_*>::begin
                         ((QList<QWidget_*> *)
                          CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
    o = QList<QWidget_*>::end
                  ((QList<QWidget_*> *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90)
                  );
    while (bVar1 = QList<QWidget_*>::const_iterator::operator!=(&local_30,o), bVar1) {
      QList<QWidget_*>::const_iterator::operator*(&local_30);
      alert((QWidget *)CONCAT44(in_ESI,in_stack_ffffffffffffffb0),
            (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
      QList<QWidget_*>::const_iterator::operator++(&local_30);
    }
    QList<QWidget_*>::~QList((QList<QWidget_*> *)0x2d486e);
  }
  else {
    QWidget::window(in_stack_ffffffffffffffa0);
    bVar1 = QWidget::isActiveWindow(in_stack_ffffffffffffffd8);
    uVar3 = false;
    if (bVar1) {
      QWidget::window(in_stack_ffffffffffffffa0);
      QWidget::windowState((QWidget *)CONCAT17(uVar3,in_stack_ffffffffffffff90));
      local_c.super_QFlagsStorage<Qt::WindowState>.i =
           (QFlagsStorage<Qt::WindowState>)
           QFlags<Qt::WindowState>::operator&
                     ((QFlags<Qt::WindowState> *)CONCAT17(uVar3,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff8c);
      uVar3 = QFlags<Qt::WindowState>::operator!((QFlags<Qt::WindowState> *)&local_c);
    }
    if (((bool)uVar3 == false) &&
       (pQVar2 = QApplicationPrivate::windowForWidget(in_stack_ffffffffffffff98),
       pQVar2 != (QWindow *)0x0)) {
      QWindow::alert((int)pQVar2);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QApplication::alert(QWidget *widget, int duration)
{
    if (widget) {
       if (widget->window()->isActiveWindow() && !(widget->window()->windowState() & Qt::WindowMinimized))
            return;
        if (QWindow *window= QApplicationPrivate::windowForWidget(widget))
            window->alert(duration);
    } else {
        const auto topLevels = topLevelWidgets();
        for (QWidget *topLevel : topLevels)
            QApplication::alert(topLevel, duration);
    }
}